

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connect.c
# Opt level: O1

timediff_t Curl_conn_shutdown_timeleft(connectdata *conn,curltime *nowp)

{
  timediff_t tVar1;
  long lVar2;
  anon_struct_40_2_458f30a3_for_shutdown *paVar3;
  long lVar4;
  long lVar5;
  bool bVar6;
  curltime cVar7;
  curltime local_40;
  
  if ((conn->shutdown).timeout_ms == 0) {
    lVar4 = 0;
  }
  else {
    paVar3 = &conn->shutdown;
    lVar4 = 0;
    lVar5 = 0;
    do {
      if (paVar3->start[0].tv_sec != 0) {
        if (nowp == (curltime *)0x0) {
          cVar7 = Curl_now();
          local_40.tv_sec = cVar7.tv_sec;
          local_40.tv_usec = cVar7.tv_usec;
          nowp = &local_40;
        }
        tVar1 = Curl_shutdown_timeleft(conn,(int)lVar5,nowp);
        if (tVar1 != 0) {
          lVar2 = lVar4;
          if (tVar1 < lVar4) {
            lVar2 = tVar1;
          }
          bVar6 = lVar4 == 0;
          lVar4 = lVar2;
          if (bVar6) {
            lVar4 = tVar1;
          }
        }
      }
      if ((conn->shutdown).timeout_ms == 0) {
        return lVar4;
      }
      paVar3 = (anon_struct_40_2_458f30a3_for_shutdown *)(paVar3->start + 1);
      bVar6 = lVar5 == 0;
      lVar5 = lVar5 + 1;
    } while (bVar6);
  }
  return lVar4;
}

Assistant:

timediff_t Curl_conn_shutdown_timeleft(struct connectdata *conn,
                                       struct curltime *nowp)
{
  timediff_t left_ms = 0, ms;
  struct curltime now;
  int i;

  for(i = 0; conn->shutdown.timeout_ms && (i < 2); ++i) {
    if(!conn->shutdown.start[i].tv_sec)
      continue;
    if(!nowp) {
      now = Curl_now();
      nowp = &now;
    }
    ms = Curl_shutdown_timeleft(conn, i, nowp);
    if(ms && (!left_ms || ms < left_ms))
      left_ms = ms;
  }
  return left_ms;
}